

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O3

int test_crop(Mat *a,Mat *starts,Mat *ends,Mat *axes)

{
  int *piVar1;
  void *__ptr;
  long *plVar2;
  int iVar3;
  long lVar4;
  Option opt;
  ParamDict pd;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_978;
  Option local_958;
  ParamDict local_930;
  
  ncnn::ParamDict::ParamDict(&local_930);
  ncnn::ParamDict::set(&local_930,9,starts);
  ncnn::ParamDict::set(&local_930,10,ends);
  ncnn::ParamDict::set(&local_930,0xb,axes);
  local_978.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_978.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_978.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ncnn::Option::Option(&local_958);
  local_958.num_threads = 1;
  local_958.use_int8_inference = false;
  local_958.use_vulkan_compute = true;
  iVar3 = test_layer<ncnn::Crop>
                    ("Crop",&local_930,&local_978,&local_958,a,0.001,(_func_void_Crop_ptr *)0x0);
  if (iVar3 != 0) {
    test_crop();
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_978);
  lVar4 = 0x8c0;
  do {
    piVar1 = *(int **)((long)&local_930.params[0].v.data + lVar4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        __ptr = *(void **)((long)&local_930.params[0].type + lVar4);
        plVar2 = *(long **)((long)&local_930.params[0].v.elempack + lVar4);
        if (plVar2 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar4 + 4) = 0;
    *(undefined8 *)((long)&local_930.params[0].type + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.data + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.dims + lVar4) = 0;
    *(undefined8 *)((long)&local_930.params[0].v.h + lVar4) = 0;
    lVar4 = lVar4 + -0x48;
  } while (lVar4 != -0x40);
  return iVar3;
}

Assistant:

static int test_crop(const ncnn::Mat& a, const ncnn::Mat& starts, const ncnn::Mat& ends, const ncnn::Mat& axes)
{
    ncnn::ParamDict pd;
    pd.set(9, starts);// starts
    pd.set(10, ends);// ends
    pd.set(11, axes);// axes

    std::vector<ncnn::Mat> weights(0);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::Crop>("Crop", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_crop failed a.dims=%d a=(%d %d %d)", a.dims, a.w, a.h, a.c);
        fprintf(stderr, " starts="); print_int_array(starts);
        fprintf(stderr, " ends="); print_int_array(ends);
        fprintf(stderr, " axes="); print_int_array(axes);
        fprintf(stderr, "\n");
    }

    return ret;
}